

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NEST.cpp
# Opt level: O0

vector<double,_std::allocator<double>_> * __thiscall
NEST::NESTcalc::GetS2
          (NESTcalc *this,int Ne,double truthPosX,double truthPosY,double truthPosZ,double smearPosX
          ,double smearPosY,double smearPosZ,double dt,double driftVelocity,uint64_t evtNum,
          double dfield,S2CalculationMode mode,int outputTiming,
          vector<long,_std::allocator<long>_> *wf_time,
          vector<double,_std::allocator<double>_> *wf_amp,
          vector<double,_std::allocator<double>_> *g2_params)

{
  double dVar1;
  value_type vVar2;
  value_type vVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  const_reference pvVar7;
  iterator __first;
  iterator __last;
  RandomGen *pRVar8;
  int64_t iVar9;
  reference pvVar10;
  RandomGen *this_00;
  size_type sVar11;
  reference pvVar12;
  ostream *poVar13;
  double *pdVar14;
  long lVar15;
  NESTcalc *this_01;
  VDetector *pVVar16;
  vector<double,_std::allocator<double>_> *pvVar17;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double extraout_XMM0_Qa_02;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double extraout_XMM0_Qa_03;
  double dVar23;
  double dVar24;
  double extraout_XMM0_Qa_04;
  double extraout_XMM0_Qa_05;
  double dVar25;
  double dVar26;
  double dVar27;
  __type _Var28;
  __type _Var29;
  double dVar30;
  double extraout_XMM0_Qa_06;
  double extraout_XMM0_Qa_07;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  pointer *local_8f0;
  pointer *local_8d8;
  pointer *local_4c8;
  pointer *local_4b0;
  double S2bc;
  vector<double,_std::allocator<double>_> local_460;
  vector<double,_std::allocator<double>_> local_448;
  value_type local_430;
  double S2b;
  double NphdC;
  double Nphd;
  double pulseAreaC;
  double NewMean;
  char line [80];
  unsigned_long local_3b0;
  int local_3a4;
  double dStack_3a0;
  int index;
  double eTime;
  vector<double,_std::allocator<double>_> local_380;
  undefined1 local_368 [8];
  vector<double,_std::allocator<double>_> PEperBin;
  value_type local_348;
  int local_33c;
  double dStack_338;
  int numPts;
  double local_330;
  vector<double,_std::allocator<double>_> local_328;
  double local_310;
  double offset;
  double phe;
  double j;
  photonstream photon_times;
  photonstream photon_emission_times;
  QuantaResult quanta;
  double origin;
  double KE;
  double min;
  double tauTrap;
  double sigmaDTg;
  double sigmaDLg;
  double dt_gas;
  double driftVelocity_gas;
  double rho;
  double dStack_258;
  bool YesGas;
  double sigmaDT;
  double sigmaDL;
  double Diff_Tran_Gas;
  double Diff_Long_Gas;
  double Diff_Long;
  double Diff_Tran;
  double newY;
  double newX;
  double sigY;
  double sigX;
  double phi;
  double DT;
  double DL_time;
  double DL;
  double elecTravT;
  undefined1 local_1d0 [8];
  vector<double,_std::allocator<double>_> TimeTable;
  vector<double,_std::allocator<double>_> AreaTableTop [2];
  vector<double,_std::allocator<double>_> AreaTableBot [2];
  vector<double,_std::allocator<double>_> electronstream;
  double amp2;
  double E_liq;
  double tau2;
  double tau1;
  double dStack_118;
  int stopPoint;
  uint64_t k;
  double pulseArea;
  uint64_t Nphe;
  uint64_t nHits;
  uint64_t Nph;
  int Nee;
  double dz;
  double posDepSm;
  double posDep;
  bool eTrain;
  double dStack_c8;
  int i;
  double subtract [2];
  double gasGap;
  double g2;
  double SE;
  double ExtEff;
  double elYield;
  vector<long,_std::allocator<long>_> *wf_time_local;
  int outputTiming_local;
  S2CalculationMode mode_local;
  uint64_t evtNum_local;
  double driftVelocity_local;
  double dt_local;
  double smearPosZ_local;
  double smearPosY_local;
  double smearPosX_local;
  double truthPosZ_local;
  double truthPosY_local;
  double truthPosX_local;
  NESTcalc *pNStack_18;
  int Ne_local;
  NESTcalc *this_local;
  undefined4 uVar36;
  
  driftVelocity_local = dt;
  dt_local = smearPosZ;
  smearPosZ_local = smearPosY;
  smearPosY_local = smearPosX;
  smearPosX_local = truthPosZ;
  truthPosZ_local = truthPosY;
  truthPosY_local = truthPosX;
  truthPosX_local._4_4_ = Ne;
  pNStack_18 = this;
  pvVar7 = std::vector<double,_std::allocator<double>_>::operator[](g2_params,0);
  dVar26 = *pvVar7;
  pvVar7 = std::vector<double,_std::allocator<double>_>::operator[](g2_params,1);
  dVar27 = *pvVar7;
  pvVar7 = std::vector<double,_std::allocator<double>_>::operator[](g2_params,2);
  dVar18 = *pvVar7;
  pvVar7 = std::vector<double,_std::allocator<double>_>::operator[](g2_params,3);
  dVar1 = *pvVar7;
  pvVar7 = std::vector<double,_std::allocator<double>_>::operator[](g2_params,4);
  dVar30 = *pvVar7;
  __first = std::vector<double,_std::allocator<double>_>::begin(&this->ionization);
  __last = std::vector<double,_std::allocator<double>_>::end(&this->ionization);
  subtract[1]._4_4_ = 0;
  std::fill<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,int>
            ((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
             __first._M_current,
             (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
             __last._M_current,(int *)((long)subtract + 0xc));
  memset(&stack0xffffffffffffff38,0,0x10);
  bVar5 = false;
  if ((mode == WaveformWithEtrain) && (bVar4 = VDetector::get_inGas(this->fdetector), !bVar4)) {
    bVar5 = true;
  }
  if (((((1.0 <= dfield) && (0.0 < dVar26)) && (0.0 < dVar27)) && ((0.0 < dVar18 && (0.0 < dVar1))))
     && (0.0 < dVar30)) {
    (*this->fdetector->_vptr_VDetector[6])
              (truthPosY_local,SUB84(truthPosZ_local,0),this->fdetector,0);
    (*this->fdetector->_vptr_VDetector[6])
              (smearPosY_local,SUB84(smearPosZ_local,0),this->fdetector,1);
    (*this->fdetector->_vptr_VDetector[6])(this->fdetector,0);
    posDepSm = extraout_XMM0_Qa / extraout_XMM0_Qa_01;
    (*this->fdetector->_vptr_VDetector[6])(this->fdetector,1);
    dz = extraout_XMM0_Qa_00 / extraout_XMM0_Qa_02;
    VDetector::get_TopDrift(this->fdetector);
    dVar18 = VDetector::get_g1_gas(this->fdetector);
    bVar4 = ValidityTests::nearlyEqual(dVar18,1.0,1e-09);
    if (bVar4) {
      posDepSm = 1.0;
      dz = 1.0;
    }
    dVar18 = VDetector::get_g1_gas(this->fdetector);
    bVar4 = ValidityTests::nearlyEqual(dVar18,0.0,1e-09);
    if (bVar4) {
      posDepSm = 0.0;
      dz = 0.0;
    }
    pRVar8 = RandomGen::rndm();
    lVar15 = (long)truthPosX_local._4_4_;
    dVar18 = -driftVelocity_local;
    dVar19 = VDetector::get_eLife_us(this->fdetector);
    dVar18 = exp(dVar18 / dVar19);
    iVar9 = RandomGen::binom_draw(pRVar8,lVar15,dVar27 * dVar18);
    iVar6 = (int)iVar9;
    nHits = 0;
    Nphe = 0;
    pulseArea = 0.0;
    k = 0;
    if ((mode == Waveform) || (mode == WaveformWithEtrain)) {
      std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)
                 &AreaTableBot[1].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      local_4b0 = &AreaTableTop[1].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
      do {
        std::vector<double,_std::allocator<double>_>::vector
                  ((vector<double,_std::allocator<double>_> *)local_4b0);
        local_4b0 = local_4b0 + 3;
      } while (local_4b0 !=
               &AreaTableBot[1].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
      local_4c8 = &TimeTable.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
      do {
        std::vector<double,_std::allocator<double>_>::vector
                  ((vector<double,_std::allocator<double>_> *)local_4c8);
        local_4c8 = local_4c8 + 3;
      } while (local_4c8 !=
               &AreaTableTop[1].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
      std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)local_1d0);
      tau1._4_4_ = iVar6;
      if (bVar5) {
        pRVar8 = RandomGen::rndm();
        lVar15 = (long)truthPosX_local._4_4_;
        dVar18 = -driftVelocity_local;
        dVar19 = VDetector::get_eLife_us(this->fdetector);
        dVar18 = exp(dVar18 / dVar19);
        iVar9 = RandomGen::binom_draw(pRVar8,lVar15,dVar18);
        tau1._4_4_ = (int)iVar9;
      }
      std::vector<double,_std::allocator<double>_>::resize
                ((vector<double,_std::allocator<double>_> *)
                 &AreaTableBot[1].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,(long)tau1._4_4_,&driftVelocity_local);
      DL = 0.0;
      dVar18 = VDetector::get_T_Kelvin(this->fdetector);
      dVar19 = VDetector::get_p_bar(this->fdetector);
      Diff_Long = GetDiffTran_Liquid(dfield,false,dVar18,dVar19,2.9,0x36);
      dVar18 = VDetector::get_T_Kelvin(this->fdetector);
      dVar19 = VDetector::get_p_bar(this->fdetector);
      Diff_Long_Gas = GetDiffLong_Liquid(dfield,false,dVar18,dVar19,2.9,0x36,-1);
      dVar18 = VDetector::get_E_gas(this->fdetector);
      dVar19 = VDetector::get_E_gas(this->fdetector);
      dVar19 = pow(dVar19 * 1000.0,2.0);
      dVar20 = VDetector::get_E_gas(this->fdetector);
      dVar20 = pow(dVar20 * 1000.0,3.0);
      Diff_Tran_Gas =
           19097.0 / (dVar18 * 1000.0) + 4.265 + -1739700.0 / dVar19 + 124770000.0 / dVar20;
      sigmaDL = Diff_Long * 0.01;
      bVar4 = VDetector::get_inGas(this->fdetector);
      if (bVar4) {
        Diff_Long = Diff_Long * 0.01;
        dVar18 = pow(dfield,2.0);
        dVar19 = pow(dfield,3.0);
        Diff_Long_Gas = ((19097.0 / dfield + 4.265) - 1739700.0 / dVar18) + 124770000.0 / dVar19;
      }
      dVar18 = sqrt((Diff_Long_Gas + Diff_Long_Gas) * driftVelocity_local * 1e-06);
      sigmaDT = dVar18 * 10.0;
      dStack_258 = sqrt((Diff_Long + Diff_Long) * driftVelocity_local * 1e-06);
      dStack_258 = dStack_258 * 10.0;
      rho._7_1_ = 1;
      dVar18 = VDetector::get_T_Kelvin(this->fdetector);
      dVar19 = VDetector::get_p_bar(this->fdetector);
      dVar20 = VDetector::get_molarMass(this->fdetector);
      dVar18 = GetDensity(dVar18,dVar19,(bool *)((long)&rho + 7),1,dVar20);
      dVar19 = VDetector::get_T_Kelvin(this->fdetector);
      dVar20 = VDetector::get_E_gas(this->fdetector);
      dVar21 = VDetector::get_p_bar(this->fdetector);
      this_01 = (NESTcalc *)this->fdetector;
      dVar22 = VDetector::get_molarMass((VDetector *)this_01);
      dVar18 = GetDriftVelocity_MagBoltz(this_01,dVar19,dVar18,dVar20 * 1000.0,dVar21,dVar22);
      dVar19 = sqrt(Diff_Tran_Gas * 2.0 * (dVar30 / dVar18) * 1e-06);
      dVar20 = sqrt(sigmaDL * 2.0 * (dVar30 / dVar18) * 1e-06);
      KE = 1e+100;
      for (posDep._4_4_ = 0; posDep._4_4_ < tau1._4_4_; posDep._4_4_ = posDep._4_4_ + 1) {
        DL = 0.0;
        pRVar8 = RandomGen::rndm();
        DL_time = RandomGen::rand_gauss(pRVar8,0.0,sigmaDT,false);
        pRVar8 = RandomGen::rndm();
        RandomGen::rand_gauss(pRVar8,0.0,dStack_258,false);
        std::abs((int)pRVar8);
        phi = extraout_XMM0_Qa_03;
        pRVar8 = RandomGen::rndm();
        dVar22 = RandomGen::rand_uniform(pRVar8);
        dVar21 = phi;
        sigX = dVar22 * 6.283185307179586;
        dVar22 = cos(sigX);
        sigY = dVar21 * dVar22;
        dVar21 = sin(sigX);
        newX = phi * dVar21;
        newY = truthPosY_local + sigY;
        Diff_Tran = truthPosZ_local + newX;
        dVar21 = Diff_Tran * Diff_Tran;
        dVar22 = newY * newY;
        dVar23 = VDetector::get_radmax(this->fdetector);
        dVar24 = VDetector::get_radmax(this->fdetector);
        if (dVar22 + dVar21 <= dVar23 * dVar24) {
          DT = DL_time / driftVelocity;
          DL = DL + DT;
          bVar4 = VDetector::get_inGas(this->fdetector);
          if (!bVar4) {
            dVar21 = VDetector::get_E_gas(this->fdetector);
            if ((dVar21 != 0.0) || (NAN(dVar21))) {
              pRVar8 = RandomGen::rndm();
              dVar21 = RandomGen::rand_uniform(pRVar8);
              dVar21 = log(dVar21);
              DL = -(5303.0 / (dfield * dfield) + 0.28326) * dVar21 + DL;
            }
          }
          dVar21 = DL;
          pvVar10 = std::vector<double,_std::allocator<double>_>::operator[]
                              ((vector<double,_std::allocator<double>_> *)
                               &AreaTableBot[1].super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage,(long)posDep._4_4_
                              );
          *pvVar10 = *pvVar10 + dVar21;
          pRVar8 = RandomGen::rndm();
          dVar21 = VDetector::get_s2Fano(this->fdetector);
          dVar21 = sqrt(dVar21 * dVar26);
          dVar21 = RandomGen::rand_gauss(pRVar8,dVar26,dVar21,true);
          dVar21 = floor(dVar21 + 0.5);
          nHits = nHits + ((long)dVar21 |
                          (long)(dVar21 - 9.223372036854776e+18) & (long)dVar21 >> 0x3f);
          pRVar8 = RandomGen::rndm();
          dVar22 = VDetector::get_g1_gas(this->fdetector);
          iVar9 = RandomGen::binom_draw
                            (pRVar8,(long)dVar21 |
                                    (long)(dVar21 - 9.223372036854776e+18) & (long)dVar21 >> 0x3f,
                             dVar22 * posDepSm);
          dVar23 = (double)iVar9;
          Nphe = Nphe + ((long)dVar23 |
                        (long)(dVar23 - 9.223372036854776e+18) & (long)dVar23 >> 0x3f);
          dVar21 = VDetector::get_TopDrift(this->fdetector);
          dVar22 = floor(dVar23 * 0.0566 + 0.5);
          GetPhotonTimes((photonstream *)
                         &photon_times.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage,this,beta,(int)dVar23,
                         (int)dVar22,dfield,(dVar18 * 4.5545e-31 * dVar18 * 1000000.0) / 1.602e-16);
          AddPhotonTransportTime
                    ((photonstream *)&j,this,
                     (photonstream *)
                     &photon_times.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage,newY,Diff_Tran,dVar21 + dVar30 * 0.5
                    );
          pRVar8 = RandomGen::rndm();
          dVar21 = VDetector::get_P_dphe(this->fdetector);
          iVar9 = RandomGen::binom_draw
                            (pRVar8,(long)dVar23 |
                                    (long)(dVar23 - 9.223372036854776e+18) & (long)dVar23 >> 0x3f,
                             dVar21);
          dVar23 = dVar23 + (double)iVar9;
          pulseArea = (double)((long)pulseArea +
                              ((long)dVar23 |
                              (long)(dVar23 - 9.223372036854776e+18) & (long)dVar23 >> 0x3f));
          pRVar8 = RandomGen::rndm();
          DL_time = RandomGen::rand_gauss(pRVar8,0.0,dVar19 * 10.0,false);
          pRVar8 = RandomGen::rndm();
          RandomGen::rand_gauss(pRVar8,0.0,dVar20 * 10.0,false);
          std::abs((int)pRVar8);
          phi = extraout_XMM0_Qa_04;
          pRVar8 = RandomGen::rndm();
          dVar22 = RandomGen::rand_uniform(pRVar8);
          dVar21 = phi;
          sigX = dVar22 * 6.283185307179586;
          dVar22 = cos(sigX);
          sigY = dVar21 * dVar22;
          dVar21 = sin(sigX);
          newX = phi * dVar21;
          newY = sigY + newY;
          Diff_Tran = newX + Diff_Tran;
          dVar21 = DL_time / dVar18;
          DT = dVar21;
          pvVar10 = std::vector<double,_std::allocator<double>_>::operator[]
                              ((vector<double,_std::allocator<double>_> *)
                               &AreaTableBot[1].super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage,(long)posDep._4_4_
                              );
          *pvVar10 = dVar21 + *pvVar10;
          if ((iVar6 <= posDep._4_4_) && (bVar5)) {
            pVVar16 = this->fdetector;
            dVar21 = VDetector::get_E_gas(pVVar16);
            std::abs((int)pVVar16);
            dVar21 = dVar21 / (1.85 / extraout_XMM0_Qa_05);
            dVar22 = VDetector::get_TopDrift(this->fdetector);
            dVar24 = exp(dVar21 * 0.15578);
            dVar21 = exp(dVar21 * 0.21177);
            pRVar8 = RandomGen::rndm();
            dVar25 = RandomGen::rand_uniform(pRVar8);
            if (((dVar21 * 0.38157 * 0.01) / 0.035) * dVar27 <= dVar25) {
              pRVar8 = RandomGen::rndm();
              dVar21 = RandomGen::rand_uniform(pRVar8);
              dVar21 = log(dVar21);
              pvVar10 = std::vector<double,_std::allocator<double>_>::operator[]
                                  ((vector<double,_std::allocator<double>_> *)
                                   &AreaTableBot[1].
                                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                    super__Vector_impl_data._M_end_of_storage,(long)posDep._4_4_);
              *pvVar10 = -(dVar24 * 1.4054 * 1000.0 * 0.01) * dVar21 + *pvVar10;
            }
            else {
              pRVar8 = RandomGen::rndm();
              dVar21 = RandomGen::rand_uniform(pRVar8);
              E_liq = (dVar22 / driftVelocity) / dVar21;
              if (1000000.0 < E_liq) {
                E_liq = 1000000.0;
              }
              pvVar10 = std::vector<double,_std::allocator<double>_>::operator[]
                                  ((vector<double,_std::allocator<double>_> *)
                                   &AreaTableBot[1].
                                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                    super__Vector_impl_data._M_end_of_storage,(long)posDep._4_4_);
              *pvVar10 = E_liq + *pvVar10;
            }
          }
          for (phe = 0.0; phe < dVar23; phe = phe + 1.0) {
            pRVar8 = RandomGen::rndm();
            this_00 = RandomGen::rndm();
            dVar21 = VDetector::get_sPEres(this->fdetector);
            dVar21 = RandomGen::FindNewMean(this_00,dVar21);
            dVar22 = VDetector::get_sPEres(this->fdetector);
            offset = RandomGen::rand_zero_trunc_gauss(pRVar8,1.0 / dVar21,dVar22);
            if ((posDep._4_4_ < iVar6) || (!bVar5)) {
              k = (uint64_t)(offset + (double)k);
            }
            dVar21 = VDetector::get_TopDrift(this->fdetector);
            pRVar8 = RandomGen::rndm();
            dVar22 = RandomGen::rand_uniform(pRVar8);
            dStack_118 = (double)((long)phe |
                                 (long)(phe - 9.223372036854776e+18) & (long)phe >> 0x3f);
            sVar11 = std::vector<double,_std::allocator<double>_>::size
                               ((vector<double,_std::allocator<double>_> *)&j);
            if (sVar11 <= (ulong)dStack_118) {
              sVar11 = std::vector<double,_std::allocator<double>_>::size
                                 ((vector<double,_std::allocator<double>_> *)&j);
              dStack_118 = (double)((long)dStack_118 - sVar11);
            }
            dVar25 = VDetector::get_anode(this->fdetector);
            pvVar10 = std::vector<double,_std::allocator<double>_>::operator[]
                                ((vector<double,_std::allocator<double>_> *)
                                 &AreaTableBot[1].
                                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage,(long)posDep._4_4_);
            dVar24 = *pvVar10;
            pvVar10 = std::vector<double,_std::allocator<double>_>::operator[]
                                ((vector<double,_std::allocator<double>_> *)&j,(size_type)dStack_118
                                );
            local_310 = ((dVar25 - (dVar30 * dVar22 + dVar21)) / dVar18 + dVar24) * 1000.0 +
                        *pvVar10;
            if (local_310 < KE) {
              KE = local_310;
            }
            pRVar8 = RandomGen::rndm();
            dVar22 = RandomGen::rand_uniform(pRVar8);
            (*this->fdetector->_vptr_VDetector[7])
                      (truthPosY_local,SUB84(truthPosZ_local,0),smearPosX_local,&local_328);
            pvVar10 = std::vector<double,_std::allocator<double>_>::operator[](&local_328,1);
            dVar21 = *pvVar10;
            std::vector<double,_std::allocator<double>_>::~vector(&local_328);
            if (dVar21 <= dVar22) {
              dStack_338 = 0.0;
              std::vector<double,_std::allocator<double>_>::emplace_back<double>
                        ((vector<double,_std::allocator<double>_> *)
                         &AreaTableTop[1].super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage,&stack0xfffffffffffffcc8
                        );
              std::vector<double,std::allocator<double>>::emplace_back<double&>
                        ((vector<double,std::allocator<double>> *)
                         &TimeTable.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage,&offset);
            }
            else {
              std::vector<double,std::allocator<double>>::emplace_back<double&>
                        ((vector<double,std::allocator<double>> *)
                         &AreaTableTop[1].super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage,&offset);
              local_330 = 0.0;
              std::vector<double,_std::allocator<double>_>::emplace_back<double>
                        ((vector<double,_std::allocator<double>_> *)
                         &TimeTable.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage,&local_330);
            }
            std::vector<double,std::allocator<double>>::emplace_back<double&>
                      ((vector<double,std::allocator<double>> *)local_1d0,&local_310);
          }
          std::vector<double,_std::allocator<double>_>::~vector
                    ((vector<double,_std::allocator<double>_> *)&j);
          std::vector<double,_std::allocator<double>_>::~vector
                    ((vector<double,_std::allocator<double>_> *)
                     &photon_times.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
        }
      }
      local_33c = SUB84(pulseArea,0) * 1000;
      if (local_33c < 100) {
        local_33c = 100;
      }
      local_348 = 0.0;
      std::vector<double,_std::allocator<double>_>::resize
                ((vector<double,_std::allocator<double>_> *)
                 &AreaTableBot[0].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,(long)local_33c,&local_348);
      PEperBin.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      std::vector<double,_std::allocator<double>_>::resize
                ((vector<double,_std::allocator<double>_> *)
                 &AreaTableTop[0].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,(long)local_33c,
                 (value_type *)
                 &PEperBin.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      dVar26 = KE - 50.0;
      for (dStack_118 = 0.0; (ulong)dStack_118 < (ulong)pulseArea;
          dStack_118 = (double)((long)dStack_118 + 1)) {
        std::vector<double,_std::allocator<double>_>::vector
                  ((vector<double,_std::allocator<double>_> *)local_368);
        pvVar10 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)
                             &AreaTableTop[1].super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage,
                             (size_type)dStack_118);
        bVar5 = ValidityTests::nearlyEqual(*pvVar10,0.0,1e-09);
        if (bVar5) {
          pVVar16 = this->fdetector;
          pvVar10 = std::vector<double,_std::allocator<double>_>::operator[]
                              ((vector<double,_std::allocator<double>_> *)
                               &TimeTable.super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage,
                               (size_type)dStack_118);
          vVar2 = *pvVar10;
          std::vector<double,_std::allocator<double>_>::operator[]
                    ((vector<double,_std::allocator<double>_> *)local_1d0,(size_type)dStack_118);
          (*pVVar16->_vptr_VDetector[9])(vVar2,&local_380);
          std::vector<double,_std::allocator<double>_>::operator=
                    ((vector<double,_std::allocator<double>_> *)local_368,&local_380);
          std::vector<double,_std::allocator<double>_>::~vector(&local_380);
        }
        else {
          pVVar16 = this->fdetector;
          pvVar10 = std::vector<double,_std::allocator<double>_>::operator[]
                              ((vector<double,_std::allocator<double>_> *)
                               &AreaTableTop[1].super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage,
                               (size_type)dStack_118);
          vVar2 = *pvVar10;
          std::vector<double,_std::allocator<double>_>::operator[]
                    ((vector<double,_std::allocator<double>_> *)local_1d0,(size_type)dStack_118);
          (*pVVar16->_vptr_VDetector[9])(vVar2,&eTime);
          std::vector<double,_std::allocator<double>_>::operator=
                    ((vector<double,_std::allocator<double>_> *)local_368,
                     (vector<double,_std::allocator<double>_> *)&eTime);
          std::vector<double,_std::allocator<double>_>::~vector
                    ((vector<double,_std::allocator<double>_> *)&eTime);
        }
        for (posDep._4_4_ = 0;
            sVar11 = std::vector<double,_std::allocator<double>_>::size
                               ((vector<double,_std::allocator<double>_> *)local_368),
            posDep._4_4_ < (int)sVar11 + -1; posDep._4_4_ = posDep._4_4_ + 1) {
          pvVar10 = std::vector<double,_std::allocator<double>_>::operator[]
                              ((vector<double,_std::allocator<double>_> *)local_368,0);
          dStack_3a0 = *pvVar10 + (double)(posDep._4_4_ * 10);
          dVar27 = floor(dStack_3a0 / 10.0 + 0.5);
          local_3a4 = (int)dVar27;
          local_3a4 = clamp(local_3a4,0,local_33c + -1);
          pvVar10 = std::vector<double,_std::allocator<double>_>::operator[]
                              ((vector<double,_std::allocator<double>_> *)
                               &AreaTableTop[1].super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage,
                               (size_type)dStack_118);
          bVar5 = ValidityTests::nearlyEqual(*pvVar10,0.0,1e-09);
          if (bVar5) {
            pvVar10 = std::vector<double,_std::allocator<double>_>::operator[]
                                ((vector<double,_std::allocator<double>_> *)
                                 &TimeTable.super__Vector_base<double,_std::allocator<double>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage,
                                 (size_type)dStack_118);
            dVar18 = dStack_3a0;
            dVar27 = *pvVar10;
            pvVar10 = std::vector<double,_std::allocator<double>_>::operator[]
                                ((vector<double,_std::allocator<double>_> *)local_1d0,
                                 (size_type)dStack_118);
            dVar18 = pow((dVar18 - *pvVar10) + dVar26,2.0);
            dVar18 = exp(-dVar18 / 200.0);
            pvVar10 = std::vector<double,_std::allocator<double>_>::operator[]
                                ((vector<double,_std::allocator<double>_> *)
                                 &AreaTableTop[0].
                                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage,(long)local_3a4);
            *pvVar10 = ((dVar27 * 10.0) / 25.06628274631001) * dVar18 + *pvVar10;
          }
          else {
            pvVar10 = std::vector<double,_std::allocator<double>_>::operator[]
                                ((vector<double,_std::allocator<double>_> *)
                                 &AreaTableTop[1].
                                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage,(size_type)dStack_118);
            dVar18 = dStack_3a0;
            dVar27 = *pvVar10;
            pvVar10 = std::vector<double,_std::allocator<double>_>::operator[]
                                ((vector<double,_std::allocator<double>_> *)local_1d0,
                                 (size_type)dStack_118);
            dVar18 = pow((dVar18 - *pvVar10) + dVar26,2.0);
            dVar18 = exp(-dVar18 / 200.0);
            pvVar10 = std::vector<double,_std::allocator<double>_>::operator[]
                                ((vector<double,_std::allocator<double>_> *)
                                 &AreaTableBot[0].
                                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage,(long)local_3a4);
            *pvVar10 = ((dVar27 * 10.0) / 25.06628274631001) * dVar18 + *pvVar10;
          }
        }
        std::vector<double,_std::allocator<double>_>::~vector
                  ((vector<double,_std::allocator<double>_> *)local_368);
      }
      for (dStack_118 = 0.0; (ulong)dStack_118 < (ulong)(long)local_33c;
          dStack_118 = (double)((long)dStack_118 + 1)) {
        pvVar10 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)
                             &AreaTableBot[0].super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage,
                             (size_type)dStack_118);
        dVar27 = *pvVar10;
        pvVar10 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)
                             &AreaTableTop[0].super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage,
                             (size_type)dStack_118);
        if (0.005 < dVar27 + *pvVar10) {
          local_3b0 = (long)(dVar26 + 5.0) + (long)dStack_118 * 10;
          std::vector<long,_std::allocator<long>_>::emplace_back<unsigned_long>(wf_time,&local_3b0);
          pvVar10 = std::vector<double,_std::allocator<double>_>::operator[]
                              ((vector<double,_std::allocator<double>_> *)
                               &AreaTableBot[0].super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage,
                               (size_type)dStack_118);
          dVar27 = *pvVar10;
          pvVar10 = std::vector<double,_std::allocator<double>_>::operator[]
                              ((vector<double,_std::allocator<double>_> *)
                               &AreaTableTop[0].super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage,
                               (size_type)dStack_118);
          line._72_8_ = dVar27 + *pvVar10;
          std::vector<double,_std::allocator<double>_>::emplace_back<double>
                    (wf_amp,(double *)(line + 0x48));
          if (-1 < outputTiming) {
            pvVar10 = std::vector<double,_std::allocator<double>_>::operator[]
                                ((vector<double,_std::allocator<double>_> *)
                                 &AreaTableBot[0].
                                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage,(size_type)dStack_118);
            if (*pvVar10 <= 140.0) {
              dStack_c8 = 0.0;
            }
            else {
              pvVar10 = std::vector<double,_std::allocator<double>_>::operator[]
                                  ((vector<double,_std::allocator<double>_> *)
                                   &AreaTableBot[0].
                                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                    super__Vector_impl_data._M_end_of_storage,(size_type)dStack_118)
              ;
              dStack_c8 = *pvVar10 - 140.0;
            }
            pvVar10 = std::vector<double,_std::allocator<double>_>::operator[]
                                ((vector<double,_std::allocator<double>_> *)
                                 &AreaTableTop[0].
                                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage,(size_type)dStack_118);
            if (*pvVar10 <= 140.0) {
              subtract[0] = 0.0;
            }
            else {
              pvVar10 = std::vector<double,_std::allocator<double>_>::operator[]
                                  ((vector<double,_std::allocator<double>_> *)
                                   &AreaTableTop[0].
                                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                    super__Vector_impl_data._M_end_of_storage,(size_type)dStack_118)
              ;
              subtract[0] = *pvVar10 - 140.0;
            }
            pvVar12 = std::vector<long,_std::allocator<long>_>::back(wf_time);
            vVar3 = *pvVar12;
            pvVar10 = std::vector<double,_std::allocator<double>_>::operator[]
                                ((vector<double,_std::allocator<double>_> *)
                                 &AreaTableBot[0].
                                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage,(size_type)dStack_118);
            dVar27 = *pvVar10 - dStack_c8;
            pvVar10 = std::vector<double,_std::allocator<double>_>::operator[]
                                ((vector<double,_std::allocator<double>_> *)
                                 &AreaTableTop[0].
                                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage,(size_type)dStack_118);
            snprintf((char *)&NewMean,0x50,"%llu\t%lld\t%.3f\t%.3f",dVar27,
                     SUB84(*pvVar10 - subtract[0],0),evtNum,vVar3);
            poVar13 = std::operator<<((ostream *)&this->pulseFile,(char *)&NewMean);
            std::ostream::operator<<(poVar13,std::endl<char,std::char_traits<char>>);
          }
        }
      }
      std::vector<double,_std::allocator<double>_>::~vector
                ((vector<double,_std::allocator<double>_> *)local_1d0);
      local_8d8 = &AreaTableTop[1].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
      do {
        local_8d8 = local_8d8 + -3;
        std::vector<double,_std::allocator<double>_>::~vector
                  ((vector<double,_std::allocator<double>_> *)local_8d8);
      } while (local_8d8 !=
               &TimeTable.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
      local_8f0 = &AreaTableBot[1].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
      do {
        local_8f0 = local_8f0 + -3;
        std::vector<double,_std::allocator<double>_>::~vector
                  ((vector<double,_std::allocator<double>_> *)local_8f0);
      } while (local_8f0 !=
               &AreaTableTop[1].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
      std::vector<double,_std::allocator<double>_>::~vector
                ((vector<double,_std::allocator<double>_> *)
                 &AreaTableBot[1].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
    }
    else {
      pRVar8 = RandomGen::rndm();
      dVar27 = VDetector::get_s2Fano(this->fdetector);
      dVar27 = sqrt(dVar27 * dVar26 * (double)iVar6);
      dVar26 = RandomGen::rand_gauss(pRVar8,dVar26 * (double)iVar6,dVar27,true);
      dVar26 = floor(dVar26 + 0.5);
      nHits = (long)dVar26 | (long)(dVar26 - 9.223372036854776e+18) & (long)dVar26 >> 0x3f;
      pRVar8 = RandomGen::rndm();
      dVar26 = VDetector::get_g1_gas(this->fdetector);
      Nphe = RandomGen::binom_draw(pRVar8,nHits,dVar26 * posDepSm);
      pRVar8 = RandomGen::rndm();
      dVar26 = VDetector::get_P_dphe(this->fdetector);
      iVar9 = RandomGen::binom_draw(pRVar8,Nphe,dVar26);
      pulseArea = (double)(Nphe + iVar9);
      pRVar8 = RandomGen::rndm();
      dVar26 = VDetector::get_sPEres(this->fdetector);
      pulseAreaC = RandomGen::FindNewMean(pRVar8,dVar26);
      pRVar8 = RandomGen::rndm();
      uVar36 = (undefined4)((ulong)pulseArea >> 0x20);
      auVar31._8_4_ = uVar36;
      auVar31._0_8_ = pulseArea;
      auVar31._12_4_ = 0x45300000;
      dVar26 = ((auVar31._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,SUB84(pulseArea,0)) - 4503599627370496.0)) / pulseAreaC;
      dVar27 = VDetector::get_sPEres(this->fdetector);
      auVar32._8_4_ = uVar36;
      auVar32._0_8_ = pulseArea;
      auVar32._12_4_ = 0x45300000;
      dVar18 = sqrt(((auVar32._8_8_ - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,SUB84(pulseArea,0)) - 4503599627370496.0)) /
                    pulseAreaC);
      k = (uint64_t)RandomGen::rand_gauss(pRVar8,dVar26,dVar27 * dVar18,true);
    }
    pdVar14 = VDetector::get_noiseLinear(this->fdetector);
    if (1.0 <= pdVar14[1]) {
      poVar13 = std::operator<<((ostream *)&std::cerr,
                                " !!WARNING!! S2 linear noise term is greater than or equal to 100% (i.e. 1.0) Did you mistake fraction for percent??"
                               );
      std::ostream::operator<<(poVar13,std::endl<char,std::char_traits<char>>);
    }
    pdVar14 = VDetector::get_noiseQuadratic(this->fdetector);
    if ((pdVar14[1] != 0.0) || (NAN(pdVar14[1]))) {
      pRVar8 = RandomGen::rndm();
      pdVar14 = VDetector::get_noiseQuadratic(this->fdetector);
      dVar26 = pdVar14[1];
      _Var28 = std::pow<double,int>((double)k,2);
      _Var28 = std::pow<double,int>(dVar26 * _Var28,2);
      pdVar14 = VDetector::get_noiseLinear(this->fdetector);
      _Var29 = std::pow<double,int>(pdVar14[1] * (double)k,2);
      dVar26 = sqrt(_Var28 + _Var29);
      k = (uint64_t)RandomGen::rand_gauss(pRVar8,(double)k,dVar26,true);
    }
    else {
      pRVar8 = RandomGen::rndm();
      pdVar14 = VDetector::get_noiseLinear(this->fdetector);
      k = (uint64_t)RandomGen::rand_gauss(pRVar8,(double)k,pdVar14[1] * (double)k,true);
    }
    dVar18 = (double)k - (dStack_c8 + subtract[0]);
    dVar26 = -driftVelocity_local;
    dVar27 = VDetector::get_eLife_us(this->fdetector);
    dVar26 = exp(dVar26 / dVar27);
    Nphd = (dVar18 / dVar26) / dz;
    dVar27 = VDetector::get_P_dphe(this->fdetector);
    dVar26 = Nphd;
    NphdC = dVar18 / (dVar27 + 1.0);
    dVar27 = VDetector::get_P_dphe(this->fdetector);
    S2b = dVar26 / (dVar27 + 1.0);
    pRVar8 = RandomGen::rndm();
    (*this->fdetector->_vptr_VDetector[7])(truthPosY_local,SUB84(truthPosZ_local,0),smearPosX_local)
    ;
    pvVar10 = std::vector<double,_std::allocator<double>_>::operator[](&local_448,1);
    dVar26 = *pvVar10;
    (*this->fdetector->_vptr_VDetector[7])
              (truthPosY_local,SUB84(truthPosZ_local,0),smearPosX_local,&local_460);
    pvVar10 = std::vector<double,_std::allocator<double>_>::operator[](&local_460,1);
    dVar27 = *pvVar10;
    (*this->fdetector->_vptr_VDetector[7])
              (truthPosY_local,SUB84(truthPosZ_local,0),smearPosX_local,&S2bc);
    pvVar10 = std::vector<double,_std::allocator<double>_>::operator[]
                        ((vector<double,_std::allocator<double>_> *)&S2bc,1);
    dVar27 = sqrt(dVar27 * dVar18 * (1.0 - *pvVar10));
    dVar26 = RandomGen::rand_gauss(pRVar8,dVar26 * dVar18,dVar27,true);
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)&S2bc);
    std::vector<double,_std::allocator<double>_>::~vector(&local_460);
    std::vector<double,_std::allocator<double>_>::~vector(&local_448);
    dVar27 = -driftVelocity_local;
    local_430 = dVar26;
    dVar30 = VDetector::get_eLife_us(this->fdetector);
    dVar27 = exp(dVar27 / dVar30);
    dVar26 = (dVar26 / dVar27) / dz;
    pvVar17 = &this->ionization;
    pvVar10 = std::vector<double,_std::allocator<double>_>::operator[](pvVar17,0);
    *pvVar10 = (double)iVar6;
    auVar33._8_4_ = (int)(nHits >> 0x20);
    auVar33._0_8_ = nHits;
    auVar33._12_4_ = 0x45300000;
    pvVar10 = std::vector<double,_std::allocator<double>_>::operator[](pvVar17,1);
    *pvVar10 = (auVar33._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)nHits) - 4503599627370496.0);
    auVar34._8_4_ = (int)(Nphe >> 0x20);
    auVar34._0_8_ = Nphe;
    auVar34._12_4_ = 0x45300000;
    pvVar10 = std::vector<double,_std::allocator<double>_>::operator[](pvVar17,2);
    *pvVar10 = (auVar34._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)Nphe) - 4503599627370496.0);
    auVar35._8_4_ = (int)((ulong)pulseArea >> 0x20);
    auVar35._0_8_ = pulseArea;
    auVar35._12_4_ = 0x45300000;
    pvVar10 = std::vector<double,_std::allocator<double>_>::operator[](&this->ionization,3);
    *pvVar10 = (auVar35._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,SUB84(pulseArea,0)) - 4503599627370496.0);
    dVar27 = VDetector::get_s2_thr(this->fdetector);
    vVar2 = local_430;
    if (dVar27 < 0.0) {
      pvVar10 = std::vector<double,_std::allocator<double>_>::operator[](&this->ionization,4);
      *pvVar10 = vVar2;
      pvVar10 = std::vector<double,_std::allocator<double>_>::operator[](&this->ionization,5);
      vVar2 = local_430;
      *pvVar10 = dVar26;
      dVar27 = VDetector::get_P_dphe(this->fdetector);
      pvVar10 = std::vector<double,_std::allocator<double>_>::operator[](&this->ionization,6);
      *pvVar10 = vVar2 / (dVar27 + 1.0);
      dVar27 = VDetector::get_P_dphe(this->fdetector);
      pvVar10 = std::vector<double,_std::allocator<double>_>::operator[](&this->ionization,7);
      *pvVar10 = dVar26 / (dVar27 + 1.0);
    }
    else {
      pvVar10 = std::vector<double,_std::allocator<double>_>::operator[](&this->ionization,4);
      dVar26 = Nphd;
      *pvVar10 = dVar18;
      pvVar10 = std::vector<double,_std::allocator<double>_>::operator[](&this->ionization,5);
      dVar27 = NphdC;
      *pvVar10 = dVar26;
      pvVar10 = std::vector<double,_std::allocator<double>_>::operator[](&this->ionization,6);
      dVar26 = S2b;
      *pvVar10 = dVar27;
      pvVar10 = std::vector<double,_std::allocator<double>_>::operator[](&this->ionization,7);
      *pvVar10 = dVar26;
    }
    pVVar16 = this->fdetector;
    VDetector::get_s2_thr(pVVar16);
    std::abs((int)pVVar16);
    if (dVar18 < extraout_XMM0_Qa_06) {
      for (posDep._4_4_ = 0; posDep._4_4_ < 8; posDep._4_4_ = posDep._4_4_ + 1) {
        pvVar10 = std::vector<double,_std::allocator<double>_>::operator[]
                            (&this->ionization,(long)posDep._4_4_);
        bVar5 = ValidityTests::nearlyEqual(*pvVar10,0.0,1e-09);
        if (bVar5) {
          pvVar10 = std::vector<double,_std::allocator<double>_>::operator[]
                              (&this->ionization,(long)posDep._4_4_);
          *pvVar10 = 1e-06;
        }
        pvVar17 = &this->ionization;
        std::vector<double,_std::allocator<double>_>::operator[](pvVar17,(long)posDep._4_4_);
        std::abs((int)pvVar17);
        pvVar10 = std::vector<double,_std::allocator<double>_>::operator[]
                            (&this->ionization,(long)posDep._4_4_);
        *pvVar10 = extraout_XMM0_Qa_07 * -1.0;
      }
    }
    pvVar10 = std::vector<double,_std::allocator<double>_>::operator[](&this->ionization,8);
    *pvVar10 = dVar1;
  }
  this_local = (NESTcalc *)&this->ionization;
  return (vector<double,_std::allocator<double>_> *)this_local;
}

Assistant:

const vector<double> &NESTcalc::GetS2(
    int Ne, double truthPosX, double truthPosY, double truthPosZ,
    double smearPosX, double smearPosY, double smearPosZ, double dt,
    double driftVelocity, uint64_t evtNum, double dfield,
    S2CalculationMode mode, int outputTiming, vector<int64_t> &wf_time,
    vector<double> &wf_amp, const vector<double> &g2_params) {
  double elYield = g2_params[0];
  double ExtEff = g2_params[1];
  double SE = g2_params[2];
  double g2 = g2_params[3];
  double gasGap = g2_params[4];

  std::fill(ionization.begin(), ionization.end(), 0);

  double subtract[2] = {0., 0.};
  int i;
  bool eTrain = false;
  if (mode == S2CalculationMode::WaveformWithEtrain &&
      !fdetector->get_inGas()) {
    eTrain = true;
  }

  if (dfield < FIELD_MIN  //"zero"-drift-field detector has no S2
      || elYield <= 0. || ExtEff <= 0. || SE <= 0. || g2 <= 0. ||
      gasGap <= 0.) {
    return ionization;
  }

  // Add some variability in g1_gas drawn from a polynomial spline fit
  double posDep =
      fdetector->FitS2(truthPosX, truthPosY,
                       VDetector::fold);  // XY is always in mm now, never cm
  double posDepSm;
  if (XYcorr == 2 || XYcorr == 3) {
    posDepSm = fdetector->FitS2(smearPosX, smearPosY, VDetector::unfold);
  } else {
    posDepSm = fdetector->FitS2(0, 0, VDetector::unfold);
  }
  posDep /= fdetector->FitS2(0., 0., VDetector::fold);
  posDepSm /= fdetector->FitS2(0., 0., VDetector::unfold);
  double dz = fdetector->get_TopDrift() - dt * driftVelocity;

  if (ValidityTests::nearlyEqual(fdetector->get_g1_gas(), 1.)) {
    posDep = 1.;
    posDepSm = 1.;
  }
  if (ValidityTests::nearlyEqual(fdetector->get_g1_gas(), 0.)) {
    posDep = 0.;
    posDepSm = 0.;
  }

  int Nee = RandomGen::rndm()->binom_draw(
      Ne, ExtEff * exp(-dt / fdetector->get_eLife_us()));
  // MAKE this 1 for SINGLE e- DEBUG

  uint64_t Nph = 0, nHits = 0, Nphe = 0;
  double pulseArea = 0.;

  if (mode == S2CalculationMode::Waveform ||
      mode == S2CalculationMode::WaveformWithEtrain) {
    uint64_t k;
    int stopPoint;
    double tau1, tau2, E_liq, amp2;
    vector<double> electronstream, AreaTableBot[2], AreaTableTop[2], TimeTable;
    if (eTrain) {
      stopPoint = RandomGen::rndm()->binom_draw(
          Ne, exp(-dt / fdetector->get_eLife_us()));
    } else {
      stopPoint = Nee;
    }
    electronstream.resize(stopPoint, dt);
    double elecTravT = 0., DL, DL_time, DT, phi, sigX, sigY, newX, newY;
    double Diff_Tran =
      GetDiffTran_Liquid(dfield, false, fdetector->get_T_Kelvin(), fdetector->get_p_bar(), DENSITY, ATOM_NUM);
    double Diff_Long =
      GetDiffLong_Liquid(dfield, false, fdetector->get_T_Kelvin(), fdetector->get_p_bar(), DENSITY, ATOM_NUM);

    // a good rule of thumb but only for liquids, as gas kind of opposite:
    // Diff_Long ~ 0.15 * Diff_Tran, as it is in LAr, at least as field goes to
    // infinity
    double Diff_Long_Gas =
        4.265 + 19097. / (1e3 * fdetector->get_E_gas()) -
        1.7397e6 / pow(1e3 * fdetector->get_E_gas(), 2.) +
        1.2477e8 / pow(1e3 * fdetector->get_E_gas(), 3.);  // Nygren, NEXT
    double Diff_Tran_Gas = Diff_Tran * 0.01;
    if (fdetector->get_inGas()) {
      Diff_Tran *= 0.01;
      Diff_Long = 4.265 + 19097. / dfield - 1.7397e6 / pow(dfield, 2.) +
                  1.2477e8 / pow(dfield, 3.);
    }
    double sigmaDL =
        10. * sqrt(2. * Diff_Long * dt *
                   1e-6);  // sqrt of cm^2/s * s = cm; times 10 for mm.
    double sigmaDT = 10. * sqrt(2. * Diff_Tran * dt * 1e-6);
    bool YesGas = true;
    double rho = GetDensity(fdetector->get_T_Kelvin(), fdetector->get_p_bar(),
                            YesGas, 1, fdetector->get_molarMass());
    double driftVelocity_gas =
      GetDriftVelocity_MagBoltz(fdetector->get_T_Kelvin(), rho, fdetector->get_E_gas() * 1000., fdetector->get_p_bar(), fdetector->get_molarMass());
    double dt_gas = gasGap / driftVelocity_gas;
    double sigmaDLg = 10. * sqrt(2. * Diff_Long_Gas * dt_gas * 1e-6);
    double sigmaDTg = 10. * sqrt(2. * Diff_Tran_Gas * dt_gas * 1e-6);
    double tauTrap = 0.28326 + 5303/(dfield*dfield);  // microseconds, to match
    // LZ SR3, LUX Run03, Xe100/10. 0.185 (fixed) based on 1310.1117 (Gaussian)
    double min = 1e100;
    for (i = 0; i < stopPoint; ++i) {
      elecTravT = 0.;  // resetting for the current electron
      DL = RandomGen::rndm()->rand_gauss(0., sigmaDL, false);
      DT = std::abs(RandomGen::rndm()->rand_gauss(0., sigmaDT, false));
      phi = two_PI * RandomGen::rndm()->rand_uniform();
      sigX = DT * cos(phi);
      sigY = DT * sin(phi);
      newX = truthPosX + sigX;
      newY = truthPosY + sigY;
      if (newX * newX + newY * newY >
          fdetector->get_radmax() * fdetector->get_radmax()) {
        continue;  // remove electrons from outside the maximum possible radius
                   // (alternative is squeeze them, depending on your E-fields)
      }
      DL_time = DL / driftVelocity;
      elecTravT += DL_time;
      if (!fdetector->get_inGas() && fdetector->get_E_gas() != 0.) {
        elecTravT -= tauTrap * log(RandomGen::rndm()->rand_uniform());
      }
      electronstream[i] += elecTravT;
      SE = floor(RandomGen::rndm()->rand_gauss(
                     elYield, sqrt(fdetector->get_s2Fano() * elYield), true) +
                 0.5);
      Nph += uint64_t(SE);
      SE = (double)RandomGen::rndm()->binom_draw(
          uint64_t(SE), fdetector->get_g1_gas() * posDep);
      nHits += uint64_t(SE);
      double KE = 0.5 * 9.109e-31 * driftVelocity_gas * driftVelocity_gas *
                  1e6 / 1.602e-16;
      double origin = fdetector->get_TopDrift() + gasGap / 2.;
      QuantaResult quanta{};
      quanta.photons = int(SE);
      quanta.electrons = 0;
      quanta.ions = 0;
      quanta.excitons = int(floor(0.0566 * SE + 0.5));
      photonstream photon_emission_times = GetPhotonTimes(
          NEST::beta, quanta.photons, quanta.excitons, dfield, KE);
      photonstream photon_times =
          AddPhotonTransportTime(photon_emission_times, newX, newY, origin);
      SE += (double)RandomGen::rndm()->binom_draw(uint64_t(SE),
                                                  fdetector->get_P_dphe());
      Nphe += uint64_t(SE);
      DL = RandomGen::rndm()->rand_gauss(0., sigmaDLg, false);
      DT = std::abs(RandomGen::rndm()->rand_gauss(0., sigmaDTg, false));
      phi = two_PI * RandomGen::rndm()->rand_uniform();
      sigX = DT * cos(phi);
      sigY = DT * sin(phi);
      newX += sigX;
      newY += sigY;
      DL_time = DL / driftVelocity_gas;
      electronstream[i] += DL_time;
      if (i >= Nee && eTrain) {  // exponential based on arXiv:1711.07025, power
                                 // on 2004.07791
        E_liq = fdetector->get_E_gas() / (EPS_LIQ / std::abs(EPS_GAS));
        tau2 = (fdetector->get_TopDrift() /
                driftVelocity);  // 0.58313 * exp(0.20929 * E_liq) * 1e3;
        tau1 = 1.40540 * exp(0.15578 * E_liq) * 1e3 * 1e-2;
        amp2 = 0.38157 * exp(0.21177 * E_liq) * 1e-2;
        if (RandomGen::rndm()->rand_uniform() < (amp2 / 0.035) * ExtEff) {
          tau2 /= RandomGen::rndm()->rand_uniform();
          if (tau2 > 1e6) tau2 = 1e6;  // 1 sec. cap
          electronstream[i] += tau2;
        } else {
          electronstream[i] -= tau1 * log(RandomGen::rndm()->rand_uniform());
        }
      }
      for (double j = 0.; j < SE; j += 1.) {
        double phe = RandomGen::rndm()->rand_zero_trunc_gauss(
            1. / RandomGen::rndm()->FindNewMean(fdetector->get_sPEres()),
            fdetector->get_sPEres());
        if (i < Nee || !eTrain) pulseArea += phe;
        origin = fdetector->get_TopDrift() +
                 gasGap * RandomGen::rndm()->rand_uniform();
        k = uint64_t(j);
        if (k >= photon_times.size()) k -= photon_times.size();
        double offset = ((fdetector->get_anode() - origin) / driftVelocity_gas +
                         electronstream[i]) *
                            1e3 +
                        photon_times[k];
        if (offset < min) min = offset;
        if (RandomGen::rndm()->rand_uniform() <
            fdetector->FitTBA(truthPosX, truthPosY, truthPosZ)[1]) {
          AreaTableBot[0].emplace_back(phe);
          AreaTableTop[0].emplace_back(0.0);
        } else {
          AreaTableBot[0].emplace_back(0.0);
          AreaTableTop[0].emplace_back(phe);
        }
        TimeTable.emplace_back(offset);
      }
    }
    int numPts = Nphe * 1000;
    if (numPts < 1000 / SAMPLE_SIZE) numPts = 1000 / SAMPLE_SIZE;
    AreaTableBot[1].resize(numPts, 0.);
    AreaTableTop[1].resize(numPts, 0.);
    min -= 5. * SAMPLE_SIZE;
    for (k = 0; k < Nphe; ++k) {
      vector<double> PEperBin;
      if (ValidityTests::nearlyEqual(AreaTableBot[0][k], 0.0))
        PEperBin =
            fdetector->SinglePEWaveForm(AreaTableTop[0][k], TimeTable[k] - min);
      else {
        PEperBin =
            fdetector->SinglePEWaveForm(AreaTableBot[0][k], TimeTable[k] - min);
      }
      for (i = 0; i < int(PEperBin.size()) - 1; ++i) {
        double eTime = PEperBin[0] + i * SAMPLE_SIZE;
        int index = int(floor(eTime / SAMPLE_SIZE + 0.5));
        index = NESTcalc::clamp(index, 0, numPts - 1);
        if (ValidityTests::nearlyEqual(AreaTableBot[0][k], 0.0))
          AreaTableTop[1][index] += 10. * AreaTableTop[0][k] /
                                    (PULSE_WIDTH * sqrt2_PI) *
                                    exp(-pow(eTime - TimeTable[k] + min, 2.) /
                                        (2. * PULSE_WIDTH * PULSE_WIDTH));
        else {
          AreaTableBot[1][index] += 10. * AreaTableBot[0][k] /
                                    (PULSE_WIDTH * sqrt2_PI) *
                                    exp(-pow(eTime - TimeTable[k] + min, 2.) /
                                        (2. * PULSE_WIDTH * PULSE_WIDTH));
        }
      }
    }
    for (k = 0; k < numPts; ++k) {
      if ((AreaTableBot[1][k] + AreaTableTop[1][k]) <= PULSEHEIGHT) continue;
      wf_time.emplace_back(k * SAMPLE_SIZE + int64_t(min + SAMPLE_SIZE / 2.));
      wf_amp.emplace_back(AreaTableBot[1][k] + AreaTableTop[1][k]);

      if (outputTiming >= 0) {
        char line[80];
        if (AreaTableBot[1][k] > PHE_MAX)
          subtract[0] = AreaTableBot[1][k] - PHE_MAX;
        else {
          subtract[0] = 0.0;
        }
        if (AreaTableTop[1][k] > PHE_MAX)
          subtract[1] = AreaTableTop[1][k] - PHE_MAX;
        else {
          subtract[1] = 0.0;
        }
        snprintf(line, 80, "%llu\t%lld\t%.3f\t%.3f",
                 (long long unsigned int)evtNum, (long long int)wf_time.back(),
                 AreaTableBot[1][k] - subtract[0],
                 AreaTableTop[1][k] - subtract[1]);
        pulseFile << line << endl;
      }
    }
  } else {
    Nph = uint64_t(
        floor(RandomGen::rndm()->rand_gauss(
                  elYield * double(Nee),
                  sqrt(fdetector->get_s2Fano() * elYield * double(Nee)), true) +
              0.5));
    nHits =
        RandomGen::rndm()->binom_draw(Nph, fdetector->get_g1_gas() * posDep);
    Nphe =
        nHits + RandomGen::rndm()->binom_draw(nHits, fdetector->get_P_dphe());
    double NewMean = RandomGen::rndm()->FindNewMean(fdetector->get_sPEres());
    pulseArea = RandomGen::rndm()->rand_gauss(
        Nphe / NewMean, fdetector->get_sPEres() * sqrt(Nphe / NewMean), true);
  }

  if (fdetector->get_noiseLinear()[1] >= 1.0)
    cerr << " !!WARNING!! S2 linear noise term is greater than or equal to 100% "
            "(i.e. 1.0) Did you mistake fraction for percent??"
         << endl;
  if (fdetector->get_noiseQuadratic()[1] != 0) {
    pulseArea = RandomGen::rndm()->rand_gauss(
        pulseArea,
        sqrt(pow(fdetector->get_noiseQuadratic()[1] * pow(pulseArea, 2), 2) +
             pow(fdetector->get_noiseLinear()[1] * pulseArea, 2)),
        true);
  } else {
    pulseArea = RandomGen::rndm()->rand_gauss(
        pulseArea, fdetector->get_noiseLinear()[1] * pulseArea, true);
  }
  pulseArea -= (subtract[0] + subtract[1]);
  double pulseAreaC =
      pulseArea / exp(-dt / fdetector->get_eLife_us()) / posDepSm;
  double Nphd = pulseArea / (1. + fdetector->get_P_dphe());
  double NphdC = pulseAreaC / (1. + fdetector->get_P_dphe());

  double S2b = RandomGen::rndm()->rand_gauss(
      fdetector->FitTBA(truthPosX, truthPosY, truthPosZ)[1] * pulseArea,
      sqrt(fdetector->FitTBA(truthPosX, truthPosY, truthPosZ)[1] * pulseArea *
           (1. - fdetector->FitTBA(truthPosX, truthPosY, truthPosZ)[1])),
      true);
  double S2bc =
      S2b / exp(-dt / fdetector->get_eLife_us()) /
      posDepSm;  // for detectors using S2 bottom-only in their analyses

  ionization[0] = Nee;  // integer number of electrons unabsorbed in liquid then
  // getting extracted
  ionization[1] = Nph;    // raw number of photons produced in the gas gap
  ionization[2] = nHits;  // MC-true integer hits in same OR different PMTs, NO
  // double phe effect
  ionization[3] = Nphe;  // MC-true integer hits WITH double phe effect (Nphe >
  // nHits). S2 has more steps than S1 (e's 1st)
  if (fdetector->get_s2_thr() >= 0) {
    ionization[4] = pulseArea;  // floating real# smeared DAQ pulse areas in
    // phe, NO XYZ correction
    ionization[5] =
        pulseAreaC;  // smeared DAQ pulse areas in phe, WITH XYZ correction
    ionization[6] = Nphd;  // same as pulse area, adjusted/corrected *downward*
    // for 2-PE effect (LUX phd units)
    ionization[7] = NphdC;  // same as Nphd, but XYZ-corrected
  }
  // Negative S2 threshold is a hidden feature, which switches from S2 -> S2
  // bottom (NOT literally negative)
  else {
    ionization[4] = S2b;  // floating real# smeared pulse areas in phe ONLY
    // including bottom PMTs, NO XYZ correction
    ionization[5] = S2bc;  // floating real# smeared pulse areas in phe ONLY
    // including bottom PMTs, WITH XYZ correction
    ionization[6] =
        S2b / (1. + fdetector->get_P_dphe());  // same as S2b, but adjusted for
    // 2-PE effect (LUX phd units)
    ionization[7] = S2bc / (1. + fdetector->get_P_dphe());  // same as S2bc, but
                                                            // adjusted for 2-PE
                                                            // effect (LUX phd
                                                            // units)
  }

  if (pulseArea < std::abs(fdetector->get_s2_thr())) {
    for (i = 0; i < 8; ++i) {
      if (ValidityTests::nearlyEqual(ionization[i], 0.))
        ionization[i] = PHE_MIN;
      ionization[i] = -1. * std::abs(ionization[i]);
    }
  }

  ionization[8] =
      g2;  // g2 = ExtEff * SE, gain of EL in gas gap (from CalculateG2)

  return ionization;
}